

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall QPDFJob::validateUnderOverlay(QPDFJob *this,QPDF *pdf,UnderOverlay *uo)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *pdf_00;
  char *pcVar2;
  element_type *password;
  type qpdf;
  ulong uVar3;
  runtime_error *e_1;
  vector<int,_std::allocator<int>_> local_160 [5];
  runtime_error *e;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_c0;
  size_type local_a8;
  int local_9c;
  undefined1 local_98 [4];
  int uo_npages;
  QPDFPageDocumentHelper uo_pdh;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_68;
  size_type local_50;
  int local_44;
  undefined1 local_40 [4];
  int main_npages;
  QPDFPageDocumentHelper main_pdh;
  UnderOverlay *uo_local;
  QPDF *pdf_local;
  QPDFJob *this_local;
  
  main_pdh.m.super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uo;
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_40,pdf);
  QPDFPageDocumentHelper::getAllPages(&local_68,(QPDFPageDocumentHelper *)local_40);
  local_50 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::size
                       (&local_68);
  iVar1 = QIntC::to_int<unsigned_long>(&local_50);
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&local_68);
  pdf_00 = main_pdh.m.
           super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 0xb;
  local_44 = iVar1;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  password = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> *)
                        (main_pdh.m.
                         super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 4));
  processFile(this,(unique_ptr<QPDF,_std::default_delete<QPDF>_> *)pdf_00,pcVar2,password,true,false
             );
  qpdf = std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::operator*
                   ((unique_ptr<QPDF,_std::default_delete<QPDF>_> *)
                    (main_pdh.m.
                     super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 0xb));
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_98,qpdf);
  QPDFPageDocumentHelper::getAllPages(&local_c0,(QPDFPageDocumentHelper *)local_98);
  local_a8 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::size
                       (&local_c0);
  iVar1 = QIntC::to_int<unsigned_long>(&local_a8);
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&local_c0);
  local_9c = iVar1;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  QUtil::parse_numrange((vector<int,_std::allocator<int>_> *)&e,pcVar2,local_44);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)
             &main_pdh.m.
              super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi[0xb]._M_use_count,(vector<int,_std::allocator<int>_> *)&e);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&e);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    QTC::TC("qpdf","QPDFJob from_nr from repeat_nr",0);
    std::__cxx11::string::operator=
              ((string *)
               (main_pdh.m.
                super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi + 7),
               (string *)
               (main_pdh.m.
                super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi + 9));
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  QUtil::parse_numrange(local_160,pcVar2,local_9c);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)
             (main_pdh.m.
              super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi + 0xd),local_160);
  std::vector<int,_std::allocator<int>_>::~vector(local_160);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    QUtil::parse_numrange((vector<int,_std::allocator<int>_> *)&e_1,pcVar2,local_9c);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)
               &main_pdh.m.
                super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi[0xe]._M_use_count,(vector<int,_std::allocator<int>_> *)&e_1);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&e_1);
  }
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_98);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_40);
  return;
}

Assistant:

void
QPDFJob::validateUnderOverlay(QPDF& pdf, UnderOverlay* uo)
{
    QPDFPageDocumentHelper main_pdh(pdf);
    int main_npages = QIntC::to_int(main_pdh.getAllPages().size());
    processFile(uo->pdf, uo->filename.c_str(), uo->password.get(), true, false);
    QPDFPageDocumentHelper uo_pdh(*(uo->pdf));
    int uo_npages = QIntC::to_int(uo_pdh.getAllPages().size());
    try {
        uo->to_pagenos = QUtil::parse_numrange(uo->to_nr.c_str(), main_npages);
    } catch (std::runtime_error& e) {
        throw std::runtime_error(
            "parsing numeric range for " + uo->which + " \"to\" pages: " + e.what());
    }
    try {
        if (uo->from_nr.empty()) {
            QTC::TC("qpdf", "QPDFJob from_nr from repeat_nr");
            uo->from_nr = uo->repeat_nr;
        }
        uo->from_pagenos = QUtil::parse_numrange(uo->from_nr.c_str(), uo_npages);
        if (!uo->repeat_nr.empty()) {
            uo->repeat_pagenos = QUtil::parse_numrange(uo->repeat_nr.c_str(), uo_npages);
        }
    } catch (std::runtime_error& e) {
        throw std::runtime_error(
            "parsing numeric range for " + uo->which + " file " + uo->filename + ": " + e.what());
    }
}